

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O0

void __thiscall
deqp::gls::RandomShaderProgram::RandomShaderProgram
          (RandomShaderProgram *this,Shader *vertexShader,Shader *fragmentShader,
          int numUnifiedUniforms,ShaderInput **unifiedUniforms)

{
  Shader *shader;
  bool bVar1;
  deBool dVar2;
  Type TVar3;
  int iVar4;
  Variable *pVVar5;
  VariableType *pVVar6;
  InternalError *pIVar7;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *pvVar8;
  reference ppSVar9;
  char *name;
  Variable *local_170;
  Variable *vertexOutput;
  ShaderInput *fragInput;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_158;
  const_iterator fragInIter;
  ShaderProgramDeclaration local_140;
  ShaderInput **local_30;
  ShaderInput **unifiedUniforms_local;
  Shader *pSStack_20;
  int numUnifiedUniforms_local;
  Shader *fragmentShader_local;
  Shader *vertexShader_local;
  RandomShaderProgram *this_local;
  
  local_30 = unifiedUniforms;
  unifiedUniforms_local._4_4_ = numUnifiedUniforms;
  pSStack_20 = fragmentShader;
  fragmentShader_local = vertexShader;
  vertexShader_local = (Shader *)this;
  generateProgramDeclaration
            (&local_140,vertexShader,fragmentShader,numUnifiedUniforms,unifiedUniforms);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,&local_140);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00cbc0d8;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00cbc110;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00cbc128;
  this->m_vertexShader = fragmentShader_local;
  this->m_fragmentShader = pSStack_20;
  this->m_numUnifiedUniforms = unifiedUniforms_local._4_4_;
  this->m_unifiedUniforms = local_30;
  pVVar5 = findShaderOutputByName(fragmentShader_local,"gl_Position");
  this->m_positionVar = pVVar5;
  std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::vector
            (&this->m_vertexOutputs);
  pVVar5 = findShaderOutputByLocation(pSStack_20,0);
  this->m_fragColorVar = pVVar5;
  std::
  map<int,_rsg::Sampler2D,_std::less<int>,_std::allocator<std::pair<const_int,_rsg::Sampler2D>_>_>::
  map(&this->m_sampler2DMap);
  std::
  map<int,_rsg::SamplerCube,_std::less<int>,_std::allocator<std::pair<const_int,_rsg::SamplerCube>_>_>
  ::map(&this->m_samplerCubeMap);
  rsg::ExecutionContext::ExecutionContext
            (&this->m_execCtx,&this->m_sampler2DMap,&this->m_samplerCubeMap);
  do {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) || (this->m_positionVar == (Variable *)0x0)) {
LAB_0082af01:
      pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar7,(char *)0x0,
                 "m_positionVar && m_positionVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_positionVar->getType().getNumElements() == 4"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
                 ,0x8d);
      __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    pVVar6 = rsg::Variable::getType(this->m_positionVar);
    TVar3 = rsg::VariableType::getBaseType(pVVar6);
    if (TVar3 != TYPE_FLOAT) goto LAB_0082af01;
    pVVar6 = rsg::Variable::getType(this->m_positionVar);
    iVar4 = rsg::VariableType::getNumElements(pVVar6);
    if (iVar4 != 4) goto LAB_0082af01;
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 && (this->m_fragColorVar != (Variable *)0x0))) {
    pVVar6 = rsg::Variable::getType(this->m_fragColorVar);
    TVar3 = rsg::VariableType::getBaseType(pVVar6);
    if (TVar3 != TYPE_FLOAT) break;
    pVVar6 = rsg::Variable::getType(this->m_fragColorVar);
    iVar4 = rsg::VariableType::getNumElements(pVVar6);
    if (iVar4 != 4) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pvVar8 = rsg::Shader::getInputs(pSStack_20);
      local_158._M_current =
           (ShaderInput **)
           std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin(pvVar8);
      do {
        pvVar8 = rsg::Shader::getInputs(pSStack_20);
        fragInput = (ShaderInput *)
                    std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end
                              (pvVar8);
        bVar1 = __gnu_cxx::operator!=
                          (&local_158,
                           (__normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                            *)&fragInput);
        if (!bVar1) {
          return;
        }
        ppSVar9 = __gnu_cxx::
                  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                  ::operator*(&local_158);
        shader = fragmentShader_local;
        vertexOutput = (Variable *)*ppSVar9;
        pVVar5 = rsg::ShaderInput::getVariable((ShaderInput *)vertexOutput);
        name = rsg::Variable::getName(pVVar5);
        local_170 = findShaderOutputByName(shader,name);
        do {
          dVar2 = ::deGetFalse();
          if ((dVar2 != 0) || (local_170 == (Variable *)0x0)) {
            pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
            tcu::InternalError::InternalError
                      (pIVar7,(char *)0x0,"vertexOutput",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
                       ,0x96);
            __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::push_back
                  (&this->m_vertexOutputs,&local_170);
        __gnu_cxx::
        __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
        ::operator++(&local_158);
      } while( true );
    }
  }
  pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar7,(char *)0x0,
             "m_fragColorVar && m_fragColorVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_fragColorVar->getType().getNumElements() == 4"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
             ,0x8e);
  __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

RandomShaderProgram::RandomShaderProgram (const rsg::Shader& vertexShader, const rsg::Shader& fragmentShader, int numUnifiedUniforms, const rsg::ShaderInput* const* unifiedUniforms)
	: sglr::ShaderProgram	(generateProgramDeclaration(vertexShader, fragmentShader, numUnifiedUniforms, unifiedUniforms))
	, m_vertexShader		(vertexShader)
	, m_fragmentShader		(fragmentShader)
	, m_numUnifiedUniforms	(numUnifiedUniforms)
	, m_unifiedUniforms		(unifiedUniforms)
	, m_positionVar			(findShaderOutputByName(vertexShader, "gl_Position"))
	, m_fragColorVar		(findShaderOutputByLocation(fragmentShader, 0))
	, m_execCtx				(m_sampler2DMap, m_samplerCubeMap)
{
	TCU_CHECK_INTERNAL(m_positionVar && m_positionVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_positionVar->getType().getNumElements() == 4);
	TCU_CHECK_INTERNAL(m_fragColorVar && m_fragColorVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_fragColorVar->getType().getNumElements() == 4);

	// Build list of vertex outputs.
	for (vector<rsg::ShaderInput*>::const_iterator fragInIter = fragmentShader.getInputs().begin(); fragInIter != fragmentShader.getInputs().end(); ++fragInIter)
	{
		const rsg::ShaderInput*	fragInput		= *fragInIter;
		const rsg::Variable*	vertexOutput	= findShaderOutputByName(vertexShader, fragInput->getVariable()->getName());

		TCU_CHECK_INTERNAL(vertexOutput);
		m_vertexOutputs.push_back(vertexOutput);
	}
}